

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O1

void __thiscall wasm::ExtractFunctionIndex::~ExtractFunctionIndex(ExtractFunctionIndex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar2 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override {
    std::string index =
      getPassOptions().getArgument("extract-function-index",
                                   "ExtractFunctionIndex usage: wasm-opt "
                                   "--extract-function-index=FUNCTION_INDEX");
    for (char c : index) {
      if (!std::isdigit(c)) {
        Fatal() << "Expected numeric function index";
      }
    }
    Index i = std::stoi(index);
    if (i >= module->functions.size()) {
      Fatal() << "Out of bounds function index " << i << "! (module has only "
              << module->functions.size() << " functions)";
    }
    // Assumes imports are at the beginning
    Name name = module->functions[i]->name;
    extract(getPassRunner(), module, name);
  }